

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O3

void __thiscall
CoinSelection_SelectCoins_KnapsackSolver_with_multiple_asset_Test::
~CoinSelection_SelectCoins_KnapsackSolver_with_multiple_asset_Test
          (CoinSelection_SelectCoins_KnapsackSolver_with_multiple_asset_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_KnapsackSolver_with_multiple_asset)
{
  // Same condition with "KnapsackSolver_match_utxo" and the other
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 39060180;
  map_target_amount[exp_dummy_asset_b.GetHex()] = 25000000;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetFeeAsset(exp_dummy_asset_a);
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      map_target_amount, GetElementsUtxoList(), exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 2);
  if (ret.size() == 2) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(26918400));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(78125000));
  }
  EXPECT_EQ(map_select_value.size(), 2);
  if (map_select_value.size() == 2) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 78125000);
    EXPECT_EQ(map_select_value[exp_dummy_asset_b.GetHex()], 26918400);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 3600);
  EXPECT_EQ(map_searched_bnb.size(), 2);
  if (map_searched_bnb.size() == 2) {
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_b.GetHex()]);
  }
}